

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipTimer.h
# Opt level: O0

void __thiscall MipTimer::reportMipCoreClock(MipTimer *this,HighsTimerClock *mip_timer_clock)

{
  initializer_list<int> __l;
  double in_stack_00000008;
  HighsInt in_stack_00000014;
  HighsTimerClock *in_stack_00000018;
  vector<int,_std::allocator<int>_> *in_stack_00000020;
  char *in_stack_00000028;
  MipTimer *in_stack_00000030;
  vector<int,_std::allocator<int>_> mip_clock_list;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff90;
  allocator_type *in_stack_ffffffffffffffa8;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  vector<int,_std::allocator<int>_> *__x;
  vector<int,_std::allocator<int>_> *this_00;
  
  uVar1 = 1;
  uVar2 = 2;
  uVar3 = 3;
  __x = (vector<int,_std::allocator<int>_> *)&stack0xffffffffffffffbc;
  this_00 = (vector<int,_std::allocator<int>_> *)0x3;
  std::allocator<int>::allocator((allocator<int> *)0x6110fb);
  __l._M_array._4_4_ = uVar1;
  __l._M_array._0_4_ = in_stack_ffffffffffffffb8;
  __l._M_len._0_4_ = uVar2;
  __l._M_len._4_4_ = uVar3;
  std::vector<int,_std::allocator<int>_>::vector
            (in_stack_ffffffffffffffb0,__l,in_stack_ffffffffffffffa8);
  std::allocator<int>::~allocator((allocator<int> *)0x611120);
  std::vector<int,_std::allocator<int>_>::vector(this_00,__x);
  reportMipClockList(in_stack_00000030,in_stack_00000028,in_stack_00000020,in_stack_00000018,
                     in_stack_00000014,in_stack_00000008);
  std::vector<int,_std::allocator<int>_>::~vector(in_stack_ffffffffffffff90);
  std::vector<int,_std::allocator<int>_>::~vector(in_stack_ffffffffffffff90);
  return;
}

Assistant:

void reportMipCoreClock(const HighsTimerClock& mip_timer_clock) {
    //    const std::vector<HighsInt>& clock = mip_timer_clock.clock_;
    const std::vector<HighsInt> mip_clock_list{
        kMipClockPresolve, kMipClockSolve, kMipClockPostsolve};
    reportMipClockList("MipCore_", mip_clock_list, mip_timer_clock,
                       kMipClockTotal);
  }